

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstar.cpp
# Opt level: O2

bool __thiscall
GMAA_MAAstar::ConstructAndValuateNextPolicies
          (GMAA_MAAstar *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  int *piVar1;
  size_t *psVar2;
  string *__lhs;
  GeneralizedMAAStarPlanner *this_00;
  size_t sVar3;
  sp_counted_base *psVar4;
  QFunctionJAOHInterface *q;
  BGIP_SolverCreatorInterface *pBVar5;
  element_type *peVar6;
  DecPOMDPDiscreteInterface *pDVar7;
  element_type *peVar8;
  undefined1 auVar9 [16];
  element_type *peVar10;
  bool bVar11;
  int iVar12;
  Index IVar13;
  ostream *poVar14;
  E *pEVar15;
  BayesianGameForDecPOMDPStage *this_01;
  BayesianGameIdenticalPayoffSolver *p;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  reference pvVar16;
  uint agI;
  size_t sVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  shared_ptr<const_BayesianGameForDecPOMDPStage> bg_ts;
  shared_ptr<BGIP_IncrementalSolverInterface> bgipIncSolver;
  PJPDP_sharedPtr jpolPrevTs;
  JPPV_sharedPtr bgpol;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
  PJPDP_sharedPtr jpolTs;
  shared_ptr<JointPolicyDiscretePure> jpdp;
  undefined1 local_370 [8];
  shared_count local_368;
  shared_ptr<PartialJointPolicyDiscretePure> local_360;
  double val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  stringstream ss;
  shared_count sStack_1b0;
  ostream local_1a8 [376];
  undefined1 extraout_var_01 [56];
  
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&jpolPrevTs);
  sVar17 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
           _m_horizon;
  sVar3 = ((jpolPrevTs.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
          super_JointPolicy._m_depth;
  bg_ts.px = (element_type *)0x0;
  bg_ts.pn.pi_ = (sp_counted_base *)0x0;
  bgipIncSolver.px = (element_type *)0x0;
  bgipIncSolver.pn.pi_ = (sp_counted_base *)0x0;
  bgips.px = (element_type *)0x0;
  bgips.pn.pi_ = (sp_counted_base *)0x0;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])(&ss);
  peVar10 = _ss;
  sVar17 = sVar17 - 1;
  boost::detail::shared_count::~shared_count(&sStack_1b0);
  iVar12 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_GeneralizedMAAStarPlanner._m_verboseness;
  if (peVar10 == (element_type *)0x0) {
    if (7 < iVar12) {
      poVar14 = std::operator<<((ostream *)&std::cout,
                                "GMAA_MAAstar: I have not expanded this ppi before...");
      std::endl<char,std::char_traits<char>>(poVar14);
    }
    this_01 = (BayesianGameForDecPOMDPStage *)operator_new(0x150);
    q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)jpolPrevTs.px;
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)jpolPrevTs.pn.pi_;
    if (jpolPrevTs.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (jpolPrevTs.pn.pi_)->use_count_ = (jpolPrevTs.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
              (this_01,(PlanningUnitDecPOMDPDiscrete *)this,q,
               (shared_ptr<const_PartialJointPolicyDiscretePure> *)&firstOHtsI);
    boost::shared_ptr<BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
              ((shared_ptr<BayesianGameForDecPOMDPStage> *)&ss,this_01);
    boost::shared_ptr<BayesianGameForDecPOMDPStage_const>::operator=
              ((shared_ptr<BayesianGameForDecPOMDPStage_const> *)&bg_ts,
               (shared_ptr<BayesianGameForDecPOMDPStage> *)&ss);
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    psVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_bgCounter;
    *psVar2 = *psVar2 + 1;
    __lhs = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_GeneralizedMAAStarPlanner._m_bgBaseFilename;
    bVar11 = std::operator!=(__lhs,"");
    if (bVar11) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar14 = std::operator<<(local_1a8,(string *)__lhs);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      peVar10 = bg_ts.px;
      std::__cxx11::stringbuf::str();
      BayesianGameIdenticalPayoff::Save
                (&peVar10->super_BayesianGameIdenticalPayoff,(string *)&firstOHtsI);
      std::__cxx11::string::~string((string *)&firstOHtsI);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    pBVar5 = this->_m_newBGIP_Solver;
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&(bg_ts.px)->super_BayesianGameIdenticalPayoff;
    if (bg_ts.px == (element_type *)0x0) {
      firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)bg_ts.pn.pi_;
    if (bg_ts.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (bg_ts.pn.pi_)->use_count_ = (bg_ts.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    p = (BayesianGameIdenticalPayoffSolver *)
        (**(code **)(*(long *)pBVar5 + 0x10))(pBVar5,&firstOHtsI);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)&ss,p);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              (&bgips,(shared_ptr<BayesianGameIdenticalPayoffSolver> *)&ss);
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface,BayesianGameIdenticalPayoffSolver>
              ((boost *)&ss,&bgips);
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator=
              (&bgipIncSolver,(shared_ptr<BGIP_IncrementalSolverInterface> *)&ss);
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    if (bgipIncSolver.px != (element_type *)0x0) {
      if (sVar3 == sVar17) {
        BGIPSolution::SetNrDesiredSolutions
                  (&((bgipIncSolver.px)->super_BayesianGameIdenticalPayoffSolver)._m_solution,1);
        if (3 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          poVar14 = std::operator<<((ostream *)&std::cout,"Last stage - set nr solutions to 1");
          std::endl<char,std::char_traits<char>>(poVar14);
        }
      }
      else if (((bgipIncSolver.px)->super_BayesianGameIdenticalPayoffSolver)._m_solution.
               _m_nrDesiredSolutions != 0x7fffffff) {
        pEVar15 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar15,"GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)")
        ;
        goto LAB_004397bf;
      }
      peVar6 = ppi->px;
      _ss = (element_type *)bgipIncSolver.px;
      sStack_1b0.pi_ = bgipIncSolver.pn.pi_;
      if (bgipIncSolver.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (bgipIncSolver.pn.pi_)->use_count_ = (bgipIncSolver.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      (*peVar6->_vptr_PartialPolicyPoolItemInterface[7])(peVar6,&ss);
      boost::detail::shared_count::~shared_count(&sStack_1b0);
LAB_004392b7:
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar14 = std::operator<<(local_1a8,"GMAA_MAAstar::NextExact_ts");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      std::__cxx11::stringbuf::str();
      this_00 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                 super_GeneralizedMAAStarPlanner;
      TimedAlgorithm::StartTimer(&this_00->super_TimedAlgorithm,(string *)&firstOHtsI);
      std::__cxx11::string::~string((string *)&firstOHtsI);
      GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
                (&this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete,ppi,&bgips);
      jpdp.px = (element_type *)0x0;
      jpdp.pn.pi_ = (sp_counted_base *)0x0;
      (bgipIncSolver.px)->_m_nrSolutionsReturned = (bgipIncSolver.px)->_m_nrSolutionsReturned + 1;
      iVar12 = (*((bgipIncSolver.px)->super_BayesianGameIdenticalPayoffSolver).
                 _vptr_BayesianGameIdenticalPayoffSolver[10])(bgipIncSolver.px,&jpdp,&val);
      if ((char)iVar12 == '\0') {
        if (0 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          poVar14 = std::operator<<((ostream *)&std::cout,
                                    "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"
                                   );
          std::endl<char,std::char_traits<char>>(poVar14);
        }
        (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])(0xffefffffffffffff);
      }
      else {
        boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
                  ((boost *)&bgpol,&jpdp);
        if (bgpol.px == (element_type *)0x0) {
          pEVar15 = (E *)__cxa_allocate_exception(0x28);
          E::E(pEVar15,"GMAA_MAAstar we did not get a valid policy from the incremental BGIP solver"
              );
          __cxa_throw(pEVar15,&E::typeinfo,E::~E);
        }
        jpolTs.px = (element_type *)0x0;
        jpolTs.pn.pi_ = (sp_counted_base *)0x0;
        iVar12 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
                   super_PlanningUnit._vptr_PlanningUnit[6])(this);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&firstOHtsI,CONCAT44(extraout_var,iVar12),(allocator_type *)&local_360);
        agI = 0;
        while( true ) {
          iVar12 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                     super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
                     super_PlanningUnit._vptr_PlanningUnit[6])(this);
          if (CONCAT44(extraout_var_00,iVar12) <= (ulong)agI) break;
          i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                        ((PlanningUnitMADPDiscrete *)this,agI,(Index)sVar3);
          IVar13 = Globals::CastLIndexToIndex(i);
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (&firstOHtsI,(ulong)agI);
          *pvVar16 = IVar13;
          agI = agI + 1;
        }
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x18])
                  (&local_360,this,jpolPrevTs.px,bgpol.px,
                   &((bg_ts.px)->super_BayesianGameIdenticalPayoff).
                    super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes,
                   &firstOHtsI);
        boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=(&jpolTs,&local_360);
        boost::detail::shared_count::~shared_count(&local_360.pn);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        pDVar7 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                 super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
        auVar22 = (**(code **)(*(long *)((long)&pDVar7->field_0x0 +
                                        *(long *)(*(long *)pDVar7 + -0xb0)) + 0x70))
                            ((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0));
        auVar21._0_8_ = auVar22._8_8_;
        auVar21._8_56_ = extraout_var_01;
        auVar9 = vcvtusi2sd_avx512f(auVar21._0_16_,sVar3);
        dVar19 = pow(auVar22._0_8_,auVar9._0_8_);
        firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)bgpol.px;
        firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)bgpol.pn.pi_;
        if (bgpol.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (bgpol.pn.pi_)->use_count_ = (bgpol.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        dVar20 = dVar19 * val;
        (*((bg_ts.px)->super_BayesianGameForDecPOMDPStageInterface).
          _vptr_BayesianGameForDecPOMDPStageInterface[5])(bg_ts.px,&firstOHtsI,0);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        dVar18 = ((jpolPrevTs.px)->super_PartialJointPolicy)._m_pastReward;
        dVar20 = dVar18 + dVar20;
        ((jpolTs.px)->super_PartialJointPolicy)._m_pastReward = dVar20;
        dVar18 = (double)((ulong)(sVar3 == sVar17) * (long)dVar20 +
                         (ulong)(sVar3 != sVar17) * (long)(dVar18 + dVar19 * val));
        peVar8 = poolOfNextPolicies->px;
        dVar19 = dVar18;
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x16])(local_370,this);
        (*peVar8->_vptr_PartialPolicyPoolInterface[8])(peVar8,local_370);
        boost::detail::shared_count::~shared_count(&local_368);
        if (sVar3 != 0) {
          (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
          (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])(dVar18);
          pDVar7 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
          dVar18 = (double)(**(code **)(*(long *)((long)&pDVar7->field_0x0 +
                                                 *(long *)(*(long *)pDVar7 + -0xb0)) + 0x70))
                                     ((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0))
          ;
          if (((dVar18 == 1.0) && (!NAN(dVar18))) &&
             ((*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])(), dVar19 < dVar18)) {
            (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
            bVar11 = Globals::EqualReward(dVar19,dVar18);
            if (!bVar11) {
              std::__cxx11::stringstream::stringstream((stringstream *)&firstOHtsI);
              std::operator<<((ostream *)
                              &firstOHtsI.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              "GMAA_MAAstar value of parent can only go down when being updated: old value="
                             );
              dVar18 = dVar19;
              poVar14 = std::ostream::_M_insert<double>(dVar19);
              std::operator<<(poVar14," new value=");
              (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
              poVar14 = std::ostream::_M_insert<double>(dVar18);
              std::operator<<(poVar14," old-new=");
              (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
              std::ostream::_M_insert<double>(dVar19 - dVar18);
              pEVar15 = (E *)__cxa_allocate_exception(0x28);
              E::E(pEVar15,(stringstream *)&firstOHtsI);
              __cxa_throw(pEVar15,&E::typeinfo,E::~E);
            }
          }
        }
        boost::detail::shared_count::~shared_count(&jpolTs.pn);
        boost::detail::shared_count::~shared_count(&bgpol.pn);
      }
      bVar11 = BGIP_IncrementalSolverInterface::AllSolutionsHaveBeenReturned(bgipIncSolver.px);
      if (bVar11) {
        bVar11 = true;
        if (3 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          poVar14 = std::operator<<((ostream *)&std::cout,"AllSolutionsHaveBeenReturned, removing ")
          ;
          (*((jpolPrevTs.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
            super_JointPolicy._vptr_JointPolicy[6])(&firstOHtsI);
          poVar14 = std::operator<<(poVar14,(string *)&firstOHtsI);
          std::endl<char,std::char_traits<char>>(poVar14);
          std::__cxx11::string::~string((string *)&firstOHtsI);
          bVar11 = true;
        }
      }
      else {
        bVar11 = false;
      }
      *cleanUpPPI = bVar11;
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(&this_00->super_TimedAlgorithm,(string *)&firstOHtsI);
      std::__cxx11::string::~string((string *)&firstOHtsI);
      boost::detail::shared_count::~shared_count(&jpdp.pn);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      boost::detail::shared_count::~shared_count(&bgips.pn);
      boost::detail::shared_count::~shared_count(&bgipIncSolver.pn);
      boost::detail::shared_count::~shared_count(&bg_ts.pn);
      boost::detail::shared_count::~shared_count(&jpolPrevTs.pn);
      return sVar3 == sVar17;
    }
    pEVar15 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar15,"GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers");
  }
  else {
    if (7 < iVar12) {
      poVar14 = std::operator<<((ostream *)&std::cout,
                                "GMAA_MAAstar: ppi was expanded before, getting the previous BGIPSolver..."
                               );
      std::endl<char,std::char_traits<char>>(poVar14);
    }
    (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])(&ss);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              (&bgips,(shared_ptr<BayesianGameIdenticalPayoffSolver> *)&ss);
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface,BayesianGameIdenticalPayoffSolver>
              ((boost *)&ss,&bgips);
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator=
              (&bgipIncSolver,(shared_ptr<BGIP_IncrementalSolverInterface> *)&ss);
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    if (bgipIncSolver.px == (element_type *)0x0) {
      pEVar15 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar15,"GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers");
    }
    else {
      firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((bgipIncSolver.px)->super_BayesianGameIdenticalPayoffSolver)._m_referredBG.px;
      firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((bgipIncSolver.px)->super_BayesianGameIdenticalPayoffSolver)._m_referredBG.pn.
                    pi_;
      psVar4 = ((bgipIncSolver.px)->super_BayesianGameIdenticalPayoffSolver)._m_referredBG.pn.pi_;
      if (psVar4 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar4->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      boost::
      dynamic_pointer_cast<BayesianGameForDecPOMDPStage_const,BayesianGameIdenticalPayoffInterface_const>
                ((boost *)&ss,(shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&firstOHtsI)
      ;
      boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::operator=
                (&bg_ts,(shared_ptr<const_BayesianGameForDecPOMDPStage> *)&ss);
      boost::detail::shared_count::~shared_count(&sStack_1b0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish);
      if (bg_ts.px != (element_type *)0x0) goto LAB_004392b7;
      pEVar15 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar15,"GMAA_MAAstar BG is not of the correct type");
    }
  }
LAB_004397bf:
  __cxa_throw(pEVar15,&E::typeinfo,E::~E);
}

Assistant:

bool GMAA_MAAstar::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI) 
{
    PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
    size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    //the BG pointer
    boost::shared_ptr<const BayesianGameForDecPOMDPStage> bg_ts;
    //the solver pointers
    //boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVector> > bgipIncSolver;
    //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> > bgips;
    boost::shared_ptr<BGIP_IncrementalSolverInterface> bgipIncSolver;
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
    // Check whether we already considered this
    // PartialJointPolicyDiscretePure before, in which case the
    // BayesianGameForDecPOMDPStage and the BGIPSolver have already
    // been generated
    if(ppi->GetBGIPSolverPointer()==0)
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstar: I have not expanded this ppi before..." << endl;

        // Construct the bayesian game for this timestep - 
        bg_ts= boost::shared_ptr<BayesianGameForDecPOMDPStage> (
            new BayesianGameForDecPOMDPStage(
                this,
                _m_qHeuristic,
                jpolPrevTs
                ));
        // not sure this pays off in terms of time vs space...
//        bg_ts->ComputeAllImmediateRewards();

        // save the BG to disk in case the user requested it
        _m_bgCounter++;
        if(_m_bgBaseFilename!="")
        {
            stringstream ss;
            ss << _m_bgBaseFilename << _m_bgCounter;
            BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
        }

        // keep track of every bg_ts we instantiate, so we can clean
        // them up after solving
//        _m_pointersToAllBGTS.push_back(bg_ts);

        //create the Bayesian game solver
        bgips =
            boost::shared_ptr<
            BayesianGameIdenticalPayoffSolver/*_T<JointPolicyPureVector>*/
            >( (*_m_newBGIP_Solver)(bg_ts) );
        bgipIncSolver = boost::dynamic_pointer_cast<
            BGIP_IncrementalSolverInterface/*_T<JointPolicyPureVector>*/ > (bgips);
        if(bgipIncSolver==0)
            throw(E("GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers"));

        if(is_last_ts)
        {
            //For the last stage we only want 1 solution.
            bgipIncSolver->SetNrDesiredSolutions(1);
            if(_m_verboseness >= 4)
                std::cout << "Last stage - set nr solutions to 1"<<endl;
        }
        else if(bgipIncSolver->GetNrDesiredSolutions()!=INT_MAX)
            throw(E("GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)"));

        // associate the resulting incremental BGIPSolver with this
        // PPI, so that we can reuse it
        ppi->SetBGIPSolverPointer(bgipIncSolver);
    }
    else
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstar: ppi was expanded before, getting the previous BGIPSolver..." << endl;
        bgips = ppi->GetBGIPSolverPointer();           
        bgipIncSolver= boost::dynamic_pointer_cast<
            BGIP_IncrementalSolverInterface/*_T<JointPolicyPureVector> */
            > (bgips);
        if(bgipIncSolver==0)
            throw(E("GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers"));
        bg_ts = boost::dynamic_pointer_cast<const BayesianGameForDecPOMDPStage>(bgipIncSolver->GetBGIPI());
        if(bg_ts==0)
            throw(E("GMAA_MAAstar BG is not of the correct type"));
    }

    stringstream ss;
    ss << "GMAA_MAAstar::NextExact_ts" << ts;
    StartTimer(ss.str());

    // Compute bounds on the value solving this CBG can result in
    this->GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds(ppi,bgips);

    // Ask the BGIPSolver for the next solution, which might not exist
    // due to the bounds on the value of the solution
    double val;
    boost::shared_ptr<JointPolicyDiscretePure> jpdp;
    /// Calling the BGIPSolver
    bool foundCBGsolution = bgipIncSolver->GetNextJointPolicyAndValue(jpdp, val);

    if(foundCBGsolution)
    {
        JPPV_sharedPtr bgpol = boost::dynamic_pointer_cast<JointPolicyPureVector>(jpdp);
        if(bgpol==0)
            throw(E("GMAA_MAAstar we did not get a valid policy from the incremental BGIP solver"));

        //Frans 20110908: what kind of construction is this: 
        PJPDP_sharedPtr jpolTs;
        {
            vector<Index> firstOHtsI(GetNrAgents());
            for(Index agI=0; agI < GetNrAgents(); agI++)
                firstOHtsI.at(agI) = 
                    CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));

            const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
            jpolTs = ConstructExtendedJointPolicy(*jpolPrevTs,
                                                  *bgpol,
                                                  nrOHts,
                                                  firstOHtsI);
        }
        //??? why the indented block?!
        
        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;
        
        //compute expected immediate reward for this stage
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        double prevPastReward = jpolPrevTs->GetPastReward();
        double newPastreward = jpolPrevTs->GetPastReward() + immR;
        jpolTs->SetPastReward(newPastreward);
        
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue = newPastreward;
        else
            newValue = prevPastReward + discounted_F;

        //push this policy and value on the priority queue
        poolOfNextPolicies->Insert( NewPPI(jpolTs,newValue) );

#if DEBUG_GMAA4
        cout <<"v = pastReward_prevTs + g^t * f = "
             << newValue <<" = "
             << jpolPrevTs->GetPastReward() <<" + "
             << discounted_F << "   "
             << "(g^t * f ="<<discountToThePowerT << " * " << val << ")"
             << endl;
#endif

        if(ts>0)
        {
            double oldValue=ppi->GetValue();
            // now we update the current PPI with the value of the next sibling
            // other option is the value of this child
//          ppi->SetValue(bgipIncSolver->GetPayoff());
            ppi->SetValue(newValue);

            if(GetDiscount()==1.0 &&
               oldValue < ppi->GetValue() &&
               !EqualReward(oldValue, ppi->GetValue()))
            {
                stringstream ss;
                ss << "GMAA_MAAstar value of parent can only go down when being updated: old value="
                   << oldValue << " new value=" << ppi->GetValue()
                   << " old-new=" << oldValue-ppi->GetValue();
                throw(E(ss));
            }
        }
    }
    else // we did NOT get a valid solution from this CBG
    {
        if(_m_verboseness >= 1)
            cout << "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"<< endl;

        // as we didn't any solution for the CBG, we know this branch
        // of the tree can never contain the optimal policy, so we set
        // its value very low
        ppi->SetValue(-DBL_MAX);
    }
    
    // if we returned all solutions from this BG, it has to be deleted
    // from the policy pool
    if(bgipIncSolver->AllSolutionsHaveBeenReturned())
    {
        if(_m_verboseness >= 4)
            cout << "AllSolutionsHaveBeenReturned, removing " << jpolPrevTs->SoftPrint()
                 << endl;
        cleanUpPPI=true;
    }
    else
        cleanUpPPI=false;

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}